

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O1

void ft_lzwstate_init(FT_LzwState state,FT_Stream source)

{
  memset(state,0,0xd8);
  state->source = source;
  state->memory = source->memory;
  state->prefix_size = 0;
  state->prefix = (FT_UShort *)0x0;
  state->suffix = (FT_Byte *)0x0;
  state->stack = state->stack_0;
  state->stack_size = 0x40;
  state->buf_total = 0;
  state->stack_top = 0;
  state->buf_offset = 0;
  state->buf_size = 0;
  state->buf_clear = '\0';
  state->num_bits = 9;
  state->phase = FT_LZW_PHASE_START;
  state->in_eof = 0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ft_lzwstate_init( FT_LzwState  state,
                    FT_Stream    source )
  {
    FT_ZERO( state );

    state->source = source;
    state->memory = source->memory;

    state->prefix      = NULL;
    state->suffix      = NULL;
    state->prefix_size = 0;

    state->stack      = state->stack_0;
    state->stack_size = sizeof ( state->stack_0 );

    ft_lzwstate_reset( state );
  }